

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O3

void cmdline_parser_print_help(void)

{
  char cVar1;
  char **ppcVar2;
  char *__s;
  
  cVar1 = *gengetopt_args_info_purpose;
  if (*gengetopt_args_info_usage == '\0') {
    if (cVar1 == '\0') goto LAB_00124ca0;
LAB_00124c91:
    puts(gengetopt_args_info_purpose);
  }
  else {
    puts(gengetopt_args_info_usage);
    if (cVar1 != '\0') goto LAB_00124c91;
  }
  putchar(10);
LAB_00124ca0:
  if (*gengetopt_args_info_description != '\0') {
    printf("%s\n\n");
  }
  if (gengetopt_args_info_help[0] != (char *)0x0) {
    ppcVar2 = gengetopt_args_info_help;
    __s = gengetopt_args_info_help[0];
    do {
      ppcVar2 = ppcVar2 + 1;
      puts(__s);
      __s = *ppcVar2;
    } while (__s != (char *)0x0);
  }
  return;
}

Assistant:

static void print_help_common(void)
{
	size_t len_purpose = strlen(gengetopt_args_info_purpose);
	size_t len_usage = strlen(gengetopt_args_info_usage);

	if (len_usage > 0) {
		printf("%s\n", gengetopt_args_info_usage);
	}
	if (len_purpose > 0) {
		printf("%s\n", gengetopt_args_info_purpose);
	}

	if (len_usage || len_purpose) {
		printf("\n");
	}

	if (strlen(gengetopt_args_info_description) > 0) {
		printf("%s\n\n", gengetopt_args_info_description);
	}
}